

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestEthernetV3(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  uint16_t local_38;
  uint16_t local_36;
  uint local_34;
  uint16_t phyid2;
  uint16_t phyid1;
  uint phyAddr;
  uint i;
  bool ret;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  _i = logFile;
  logFile_local = (ofstream *)Port;
  Port_local = (BasePort *)Board;
  Board_local._4_4_ = curLine;
  poVar2 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"=== Ethernet (RTL8211F) Test ===");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  phyAddr._3_1_ = 1;
  for (_phyid2 = 1; _phyid2 < 3; _phyid2 = _phyid2 + 1) {
    local_34 = 1;
    local_36 = 0;
    local_38 = 0;
    bVar1 = FpgaIO::ReadRTL8211F_Register((FpgaIO *)Port_local,_phyid2,1,2,&local_36);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)_i,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," PHYID1");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register((FpgaIO *)Port_local,_phyid2,local_34,3,&local_38);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)_i,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," PHYID2");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)_i,"PHY");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
    poVar2 = std::operator<<(poVar2," PHYID = ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_36);
    poVar2 = std::operator<<(poVar2,", ");
    std::ostream::operator<<(poVar2,local_38);
    if ((local_36 == 0x1c) && (local_38 == 0xc916)) {
      poVar2 = std::operator<<((ostream *)_i," - PASS");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)_i," - FAIL (should be 1c, c916)");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      phyAddr._3_1_ = 0;
    }
  }
  return (bool)(phyAddr._3_1_ & 1);
}

Assistant:

bool TestEthernetV3(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile)
{
    logFile << std::endl << "=== Ethernet (RTL8211F) Test ===" << std::endl;
    bool ret = true;
    for (unsigned int i = 1; i <= 2; i++) {
        unsigned int phyAddr = FpgaIO::PHY_RTL8211F;
        uint16_t phyid1 = 0, phyid2 = 0;
        if (!Board.ReadRTL8211F_Register(i, phyAddr, FpgaIO::RTL8211F_PHYID1, phyid1))
            logFile << "Failed to read PHY" << i << " PHYID1" << std::endl;
        if (!Board.ReadRTL8211F_Register(i, phyAddr, FpgaIO::RTL8211F_PHYID2, phyid2))
            logFile << "Failed to read PHY" << i << " PHYID2" << std::endl;
        logFile << "PHY" << i << " PHYID = " << std::hex
                << phyid1 << ", " << phyid2;
        if ((phyid1 == 0x001c) && (phyid2 == 0xc916)) {
            logFile << " - PASS" << std::dec << std::endl;
        }
        else {
            logFile << " - FAIL (should be 1c, c916)" << std::dec << std::endl;
            ret = false;
        }
    }
    return ret;
}